

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.h
# Opt level: O1

void __thiscall
Js::JavascriptPromiseThenFinallyFunction::JavascriptPromiseThenFinallyFunction
          (JavascriptPromiseThenFinallyFunction *this,DynamicType *type,FunctionInfo *functionInfo,
          RecyclableObject *OnFinally,RecyclableObject *Constructor,bool shouldThrow)

{
  RuntimeFunction::RuntimeFunction(&this->super_RuntimeFunction,type,functionInfo);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_014e7e78;
  Memory::Recycler::WBSetBit((char *)&this->OnFinally);
  (this->OnFinally).ptr = OnFinally;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->OnFinally);
  Memory::Recycler::WBSetBit((char *)&this->Constructor);
  (this->Constructor).ptr = Constructor;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->Constructor);
  this->shouldThrow = shouldThrow;
  return;
}

Assistant:

JavascriptPromiseThenFinallyFunction(DynamicType* type, FunctionInfo* functionInfo, RecyclableObject* OnFinally, RecyclableObject* Constructor, bool shouldThrow)
            : RuntimeFunction(type, functionInfo), OnFinally(OnFinally), Constructor(Constructor), shouldThrow(shouldThrow)
        { }